

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

shared_ptr<Promise> createLoopedDelay(void)

{
  Promise *this;
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<Promise> *child;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<Promise> *p;
  Promise *in_RDI;
  shared_ptr<Promise> sVar6;
  shared_ptr<Promise> promise;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  Delay *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58 [24];
  _Any_data local_40;
  _Any_data local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  createLoopedDelay::max = createLoopedDelay::max + -1;
  if (createLoopedDelay::max == 0) {
    puts("DONE LOOP");
    Promise::New();
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDI->_vptr_Promise;
    _Var5._M_pi[5]._M_weak_count = 1;
    pp_Var1 = _Var5._M_pi[6]._vptr__Sp_counted_base;
    if (pp_Var1 != (_func_int **)0x0) {
      p_Var4 = _Var5._M_pi + 8;
      _Var5._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&_Var5._M_pi[8]._M_use_count;
      for (p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4->_vptr__Sp_counted_base;
          p_Var4 != _Var5._M_pi; p_Var4 = p_Var4 + 1) {
        p_Var4->_vptr__Sp_counted_base[0xd] = (_func_int *)pp_Var1;
      }
    }
  }
  else {
    if (timestamp()::prev == '\0') {
      createLoopedDelay();
    }
    lVar2 = std::chrono::_V2::system_clock::now();
    lVar3 = lVar2 - timestamp()::prev;
    timestamp()::prev = lVar2;
    printf("%lli: ",lVar3 / 1000000);
    puts("Creating Looped Delay");
    local_40._12_4_ = 2000;
    local_68 = (Delay *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Delay,std::allocator<Delay>,int>
              (&_Stack_60,&local_68,(allocator<Delay> *)&local_88,
               (int *)(local_40._M_pod_data + 0xc));
    std::__shared_ptr<Delay,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Delay,Delay>
              ((__shared_ptr<Delay,(__gnu_cxx::_Lock_policy)2> *)&local_68,local_68);
    local_30._M_unused._M_object = local_68;
    local_30._8_8_ = _Stack_60._M_pi;
    local_68 = (Delay *)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Promise::Register((Promise *)local_58,(shared_ptr<Promise> *)&local_30);
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb0);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108bb8;
    this = (Promise *)(p_Var4 + 1);
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(std::shared_ptr<Promise>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Badrpas[P]es-promise-cpp/test.cpp:15:14)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(std::shared_ptr<Promise>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Badrpas[P]es-promise-cpp/test.cpp:15:14)>
               ::_M_manager;
    Promise::Promise(this,(ManuallyResolvedHandler *)&local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    local_90._M_pi = p_Var4;
    if ((p_Var4[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
       (*(int *)(p_Var4[2]._vptr__Sp_counted_base + 1) == 0)) {
      *(Promise **)&p_Var4[1]._M_use_count = this;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 2),&local_90);
    }
    local_88._8_8_ = local_90._M_pi;
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      }
    }
    local_88._M_unused._M_object = this;
    Promise::Register((Promise *)(local_58 + 0x10),(shared_ptr<Promise> *)&local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
    }
    sVar6 = Promise::Then(in_RDI,(shared_ptr<Promise> *)local_58._0_8_);
    _Var5 = sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_unused._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_unused._0_8_);
      _Var5._M_pi = extraout_RDX;
    }
    if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      _Var5._M_pi = extraout_RDX_00;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
      _Var5._M_pi = extraout_RDX_01;
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      _Var5._M_pi = extraout_RDX_02;
    }
  }
  sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Promise>)sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PromisePtr createLoopedDelay() {
  static int max = 5;
  if (!--max) {
    printf("DONE LOOP\n");
    auto p = Promise::New();
    p->Resolve();
    return p;
  }

  timestamp(); printf("Creating Looped Delay\n");
  return Promise::Register(std::make_shared<Delay>(2000))
      ->Then([](const std::shared_ptr<Promise>& p) {
        timestamp(); printf("Delay Resolved LOOPED\n");
        p->Resolve(createLoopedDelay());
      });
}